

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::PatchableRootProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore,
          bool registerCacheIdForCall)

{
  code *pcVar1;
  CacheIdUnit this_00;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  Phase phase;
  CacheIdUnit local_50;
  CacheIdUnit unit;
  RegSlot local_38;
  OpCode local_32;
  RegSlot value_local;
  OpCode op_local;
  
  local_38 = value;
  local_32 = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x38);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  unit = (CacheIdUnit)this;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x773,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00892979;
    *puVar3 = 0;
  }
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x774,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) goto LAB_00892979;
    *puVar3 = 0;
  }
  this_00 = unit;
  if (value == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar2) {
      *puVar3 = 0;
      Throw::InternalError();
    }
    goto LAB_00892979;
  }
  pFVar4 = *(FunctionBody **)((long)unit + 0x68);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar2) goto LAB_00892979;
    *puVar3 = 0;
    pFVar4 = *(FunctionBody **)((long)this_00 + 0x68);
  }
  local_38 = FunctionBody::MapRegSlot(pFVar4,value);
  if (op < StRootFld) {
    if (op < LdRootFld) {
      if ((op != InitRootLetFld) && (op != InitRootConstFld)) goto LAB_008928cf;
    }
    else {
      if (op != LdRootFld) {
        if (op == LdRootMethodFld) {
          if (registerCacheIdForCall) {
            local_50.isRootObjectCache = true;
            local_50.cacheId = cacheId;
            bVar2 = JsUtil::
                    BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::TryGetValue<unsigned_int>
                              (*(BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                 **)((long)this_00 + 0x118),&local_38,&local_50);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar3 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0x789,
                                          "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))"
                                          ,"!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)"
                                         );
              if (!bVar2) goto LAB_00892979;
              *puVar3 = 0;
            }
            JsUtil::
            BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      (*(BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                         **)((long)this_00 + 0x118),&local_38,&local_50);
          }
          goto LAB_008927cc;
        }
        goto LAB_008928cf;
      }
LAB_00892778:
      bVar2 = DynamicProfileInfo::IsEnabled
                        (AggressiveIntTypeSpecPhase,*(FunctionBody **)((long)this_00 + 0x68));
      if ((((!bVar2) &&
           (bVar2 = DynamicProfileInfo::IsEnabled
                              (FloatTypeSpecPhase,*(FunctionBody **)((long)this_00 + 0x68)), !bVar2)
           ) && (bVar2 = DynamicProfileInfo::IsEnabled
                                   (ObjTypeSpecPhase,*(FunctionBody **)((long)this_00 + 0x68)),
                !bVar2)) &&
         (bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,InlinePhase,false), !bVar2)) {
        pFVar4 = *(FunctionBody **)((long)this_00 + 0x68);
        phase = ProfileBasedFldFastPathPhase;
LAB_008927fa:
        bVar2 = DynamicProfileInfo::IsEnabled(phase,pFVar4);
        if (!bVar2) goto LAB_0089280c;
      }
LAB_00892803:
      OpCodeUtil::ConvertNonCallOpToProfiled(&local_32);
    }
  }
  else {
    if (op < InitRootFld) {
      if ((op == StRootFld) || (op == StRootFldStrict)) {
LAB_008927cc:
        bVar2 = DynamicProfileInfo::IsEnabled
                          (ProfileBasedFldFastPathPhase,*(FunctionBody **)((long)this_00 + 0x68));
        if ((!bVar2) &&
           (bVar2 = DoDynamicProfileOpcode((ByteCodeWriter *)this_00,InlinePhase,false), !bVar2)) {
          pFVar4 = *(FunctionBody **)((long)this_00 + 0x68);
          phase = ObjTypeSpecPhase;
          goto LAB_008927fa;
        }
        goto LAB_00892803;
      }
    }
    else {
      if (op == InitRootFld) goto LAB_008927cc;
      if (op == LdRootFldForTypeOf) goto LAB_00892778;
    }
LAB_008928cf:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x79a,"(false)",
                                "The specified OpCode is not intended for patchable root field-access"
                               );
    if (!bVar2) goto LAB_00892979;
    *puVar3 = 0;
  }
LAB_0089280c:
  bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    ((ByteCodeWriter *)this_00,local_32,local_38,cacheId,isLoadMethod,isStore);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         ((ByteCodeWriter *)this_00,local_32,local_38,cacheId,isLoadMethod,isStore),
      !bVar2)) &&
     (bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        ((ByteCodeWriter *)this_00,local_32,local_38,cacheId,isLoadMethod,isStore),
     !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x79e,"(success)","success");
    if (!bVar2) {
LAB_00892979:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchableRootProperty(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementRootCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        Assert(!isLoadMethod || !isStore);

        value = ConsumeReg(value);

        switch (op)
        {
        case OpCode::LdRootFld:
        case OpCode::LdRootFldForTypeOf:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdRootMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId, true);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
        case OpCode::StRootFld:
        case OpCode::StRootFldStrict:
        case OpCode::InitRootFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitRootLetFld:
        case OpCode::InitRootConstFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable root field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementRootCP, op, value, cacheId, isLoadMethod, isStore);
    }